

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utFBXImporterExporter.cpp
# Opt level: O0

void __thiscall
utFBXImporterExporter_importUnitScaleFactor_Test::~utFBXImporterExporter_importUnitScaleFactor_Test
          (utFBXImporterExporter_importUnitScaleFactor_Test *this)

{
  utFBXImporterExporter_importUnitScaleFactor_Test *this_local;
  
  ~utFBXImporterExporter_importUnitScaleFactor_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(utFBXImporterExporter, importUnitScaleFactor) {
    Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/FBX/global_settings.fbx", aiProcess_ValidateDataStructure);

    EXPECT_NE(nullptr, scene);
    EXPECT_NE(nullptr, scene->mMetaData);

    double factor(0.0);
    scene->mMetaData->Get("UnitScaleFactor", factor);
    EXPECT_DOUBLE_EQ(500.0, factor);
}